

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O1

void __thiscall input_mod::Play(input_mod *this,bool looping,int order)

{
  SoundStream *pSVar1;
  bool bVar2;
  int iVar3;
  
  (this->super_StreamSong).super_MusInfo.m_Status = STATE_Stopped;
  (this->super_StreamSong).super_MusInfo.m_Looping = looping;
  this->start_order = order;
  bVar2 = open2(this,0);
  if (bVar2) {
    pSVar1 = (this->super_StreamSong).m_Stream;
    iVar3 = (*pSVar1->_vptr_SoundStream[2])
                      (0x3f800000,pSVar1,(ulong)(this->super_StreamSong).super_MusInfo.m_Looping);
    if ((char)iVar3 != '\0') {
      (this->super_StreamSong).super_MusInfo.m_Status = STATE_Playing;
    }
  }
  return;
}

Assistant:

void input_mod::Play(bool looping, int order)
{
	m_Status = STATE_Stopped;
	m_Looping = looping;

	start_order = order;
	if (open2(0) && m_Stream->Play(m_Looping, 1))
	{
		m_Status = STATE_Playing;
	}
}